

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Pivot.c
# Opt level: O0

void Llb_ManLabelLiCones(Aig_Man_t *p)

{
  Vec_Ptr_t *p_00;
  int iVar1;
  Aig_Obj_t *pAVar2;
  void *pvVar3;
  int local_1c;
  int i;
  Aig_Obj_t *pObj;
  Aig_Man_t *p_local;
  
  pAVar2 = Aig_ManConst1(p);
  *(ulong *)&pAVar2->field_0x18 = *(ulong *)&pAVar2->field_0x18 & 0xffffffffffffffdf | 0x20;
  for (local_1c = 0; iVar1 = Vec_PtrSize(p->vCis), local_1c < iVar1; local_1c = local_1c + 1) {
    pvVar3 = Vec_PtrEntry(p->vCis,local_1c);
    *(ulong *)((long)pvVar3 + 0x18) = *(ulong *)((long)pvVar3 + 0x18) & 0xffffffffffffffdf | 0x20;
  }
  for (local_1c = 0; iVar1 = Saig_ManRegNum(p), local_1c < iVar1; local_1c = local_1c + 1) {
    p_00 = p->vCos;
    iVar1 = Saig_ManPoNum(p);
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p_00,local_1c + iVar1);
    pAVar2 = Aig_ObjFanin0(pAVar2);
    Llb_ManLabelLiCones_rec(p,pAVar2);
  }
  return;
}

Assistant:

void Llb_ManLabelLiCones( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i;
    // mark const and PIs
    Aig_ManConst1(p)->fMarkB = 1;
    Aig_ManForEachCi( p, pObj, i )
        pObj->fMarkB = 1;
    // mark cones
    Saig_ManForEachLi( p, pObj, i )
        Llb_ManLabelLiCones_rec( p, Aig_ObjFanin0(pObj) );
}